

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
* toml::detail::parse_file<toml::type_config>
            (result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  long *plVar3;
  pointer pcVar4;
  string *psVar5;
  undefined1 uVar6;
  undefined1 auVar7 [8];
  pointer psVar8;
  pointer pbVar9;
  pointer pbVar10;
  table_format_info *ptVar11;
  value_type *pvVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  error_type *peVar14;
  value_type *pvVar15;
  error_type *peVar16;
  table_type *ptVar17;
  value_type *ppbVar18;
  error_type *peVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  basic_value<toml::type_config> *extraout_RDX;
  basic_value<toml::type_config> *extraout_RDX_00;
  basic_value<toml::type_config> *extraout_RDX_01;
  basic_value<toml::type_config> *extraout_RDX_02;
  basic_value<toml::type_config> *extraout_RDX_03;
  basic_value<toml::type_config> *pbVar21;
  basic_value<toml::type_config> *extraout_RDX_04;
  basic_value<toml::type_config> *v;
  int32_t iVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer pbVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  context<toml::type_config> *__str;
  location *plVar28;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var29;
  EVP_PKEY_CTX *pEVar30;
  location *plVar31;
  basic_value<toml::type_config> *pbVar32;
  _Alloc_hider _Var33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  scanner_storage *other;
  pointer psVar35;
  long lVar36;
  bool bVar37;
  initializer_list<unsigned_char> cs;
  table_format_info fmt;
  table_format_info fmt_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  com;
  optional<toml::detail::multiline_spacer<toml::type_config>_> sp;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> inserted;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  result<toml::detail::none_t,_toml::error_info> res_1;
  result<toml::detail::none_t,_toml::error_info> res;
  value_type com_opt;
  location first;
  value_type root;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1508;
  _func_int **local_14f0;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *local_14e8;
  undefined1 local_14e0 [32];
  bool local_14c0;
  ulong local_14b8;
  _func_int **local_14b0;
  undefined1 local_14a8 [16];
  _Alloc_hider local_1498;
  pointer local_1490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1488;
  size_t local_1478;
  size_t sStack_1470;
  undefined4 local_1468;
  undefined4 uStack_1464;
  undefined4 uStack_1460;
  undefined4 uStack_145c;
  size_t local_1458;
  size_t sStack_1450;
  size_t local_1448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1438;
  undefined1 local_1418 [8];
  undefined1 local_1410 [88];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_13b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_13b0;
  size_t *local_13a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_13a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_1398;
  character local_1390;
  undefined1 local_1380 [8];
  undefined1 local_1378 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1370;
  undefined4 local_1350;
  undefined4 uStack_134c;
  undefined4 uStack_1348;
  undefined4 uStack_1344;
  undefined8 local_1340;
  region local_1338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12d0;
  undefined1 local_12b8 [8];
  anon_union_88_2_fd5fb55d_for_result<toml::detail::none_t,_toml::error_info>_3 local_12b0;
  string local_1258;
  string local_1238;
  string local_1218;
  string local_11f8;
  string local_11d8;
  string local_11b8;
  string local_1198;
  string local_1178;
  comment_type *local_1158;
  ulong local_1150;
  comment_type *local_1148;
  error_info local_1140;
  undefined1 local_10e8 [8];
  undefined1 auStack_10e0 [168];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1038;
  undefined1 local_1020 [8];
  undefined1 local_1018 [128];
  undefined1 local_f98 [56];
  _Alloc_hider local_f60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f50;
  undefined1 local_f40 [56];
  _Alloc_hider local_f08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef8;
  undefined1 local_ee8 [56];
  _Alloc_hider local_eb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea0;
  undefined1 local_e90 [56];
  _Alloc_hider local_e58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e48;
  undefined1 local_e38 [56];
  _Alloc_hider local_e00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_df0;
  undefined1 local_de0 [56];
  _Alloc_hider local_da8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d98;
  undefined1 local_d88 [56];
  _Alloc_hider local_d50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d40;
  undefined1 local_d30 [56];
  _Alloc_hider local_cf8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ce8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cb8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c98;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c58;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c18;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_bd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b78;
  either local_b60;
  either local_b40;
  undefined1 local_b20 [56];
  _Alloc_hider local_ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ad8;
  region local_ac8;
  error_info local_a60;
  error_info local_a08;
  error_info local_9b0;
  error_info local_958;
  undefined1 local_900 [48];
  size_t local_8d0;
  size_t sStack_8c8;
  size_t local_8c0;
  undefined1 local_8b8 [104];
  undefined1 local_850 [176];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7a0;
  region local_788;
  region local_718;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_6a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_668;
  location local_628;
  location local_5e0;
  location local_598;
  location local_550;
  vector<toml::error_info,_std::allocator<toml::error_info>_> local_508;
  region local_4f0;
  region local_488;
  basic_value<toml::type_config> local_420;
  basic_value<toml::type_config> local_358;
  basic_value<toml::type_config> local_290;
  basic_value<toml::type_config> local_1c8;
  region local_100;
  region local_98;
  
  local_14e8 = __return_storage_ptr__;
  location::location((location *)local_900,loc);
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    local_6a8._M_buckets = &local_6a8._M_single_bucket;
    local_6a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_6a8._M_element_count = 0;
    local_6a8._M_bucket_count = 1;
    local_6a8._M_rehash_policy._M_max_load_factor = 1.0;
    local_6a8._M_rehash_policy._4_4_ = 0;
    local_6a8._M_rehash_policy._M_next_resize = 0;
    local_6a8._M_single_bucket = (__node_base_ptr)0x0;
    local_cd8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_cd8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_cd8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_4f0,loc);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_850,(table_type *)&local_6a8,
               (table_format_info)ZEXT816(0),&local_cd8,&local_4f0);
    region::~region(&local_4f0);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_cd8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_6a8);
    ptVar11 = basic_value<toml::type_config>::as_table_fmt
                        ((basic_value<toml::type_config> *)local_850);
    ptVar11->fmt = multiline;
    ptVar11 = basic_value<toml::type_config>::as_table_fmt
                        ((basic_value<toml::type_config> *)local_850);
    local_13a8 = &loc->location_;
    ptVar11->indent_type = none;
    pbVar32 = (basic_value<toml::type_config> *)&ctx->errors_;
    local_1398 = &(loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
    local_13a0 = &loc->source_name_;
    local_14b0 = (_func_int **)&PTR__repeat_at_least_00539a98;
    local_14f0 = (_func_int **)&PTR__scanner_base_00539820;
    do {
      paVar34 = &local_1140.title_.field_2;
      __str = (context<toml::type_config> *)local_8b8;
      peVar2 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if ((ulong)((long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start) <= loc->location_) break;
      parse_comment_line<toml::type_config>
                ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  *)local_1380,loc,ctx);
      if (local_1380[0] == true) {
        pvVar12 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                            *)local_1380,(source_location)0x539bd8);
        local_1018[0x18] = 0;
        bVar37 = (pvVar12->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_engaged == true;
        if (bVar37) {
          local_1020 = (undefined1  [8])(local_1018 + 8);
          _Var33._M_p = (pvVar12->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1020,_Var33._M_p,
                     _Var33._M_p +
                     (pvVar12->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_string_length);
          iVar26 = 0;
          __str = (context<toml::type_config> *)local_1020;
          local_1018[0x18] = bVar37;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_7a0
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
        }
        else {
          local_ac8.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)
                    CONCAT62(local_ac8.source_.
                             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._2_6_,0x920);
          cs._M_len = 2;
          cs._M_array = (iterator)&local_ac8;
          local_1018[0x18] = bVar37;
          character_either::character_either((character_either *)local_14a8,cs);
          local_1418 = (undefined1  [8])local_14b0;
          local_1410._0_8_ = (value_type)0x0;
          scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
                    ((scanner_storage *)(local_1410 + 8),(character_either *)local_14a8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_14a8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            operator_delete((void *)local_14a8._8_8_,(long)local_1490 - local_14a8._8_8_);
          }
          local_12b8 = (undefined1  [8])local_14f0;
          local_12b0._0_1_ = 10;
          local_ac8.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)&PTR__scanner_base_00539938;
          local_ac8.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x439f29;
          local_ac8.source_name_._M_dataplus._M_p = (pointer)0x2;
          either::either<toml::detail::character,toml::detail::literal>
                    ((either *)local_14a8,(character *)local_12b8,(literal *)&local_ac8);
          sequence::sequence<toml::detail::repeat_at_least,toml::detail::either>
                    ((sequence *)__str,(repeat_at_least *)local_1418,(either *)local_14a8);
          sequence::scan((region *)local_10e8,(sequence *)__str,loc);
          auVar7 = local_10e8;
          region::~region((region *)local_10e8);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(local_8b8 + 8));
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(local_14a8 + 8));
          if ((_Head_base<0UL,_toml::detail::scanner_base_*,_false>)local_1410._8_8_ !=
              (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
            (*(*(_func_int ***)local_1410._8_8_)[1])();
          }
          iVar26 = 3;
          if (auVar7 == (undefined1  [8])0x0) {
            (loc->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_900._0_8_;
            CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (local_1398,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_900 + 8));
            __str = (context<toml::type_config> *)(local_900 + 0x10);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(local_13a0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
            pbVar10 = local_7a0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pbVar9 = local_7a0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_13a8[2] = local_8c0;
            *local_13a8 = local_8d0;
            local_13a8[1] = sStack_8c8;
            if (local_7a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_7a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar23 = &(local_7a0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar23 + -1))->_M_dataplus)._M_p;
                if (paVar23 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar3) {
                  __str = (context<toml::type_config> *)(paVar23->_M_allocated_capacity + 1);
                  operator_delete(plVar3,(ulong)__str);
                }
                pbVar24 = (pointer)(paVar23 + 1);
                paVar23 = paVar23 + 2;
              } while (pbVar24 != pbVar10);
              local_7a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
            }
          }
        }
        if ((local_1018[0x18] == '\x01') &&
           (local_1018[0x18] = '\0', local_1020 != (undefined1  [8])(local_1018 + 8))) {
          __str = (context<toml::type_config> *)
                  ((long)&((_Alloc_hider *)local_1018._8_8_)->_M_p + 1);
          operator_delete((void *)local_1020,(ulong)__str);
        }
        if (bVar37) goto LAB_0039f9c5;
      }
      else {
        peVar16 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                *)local_1380,(source_location)0x539bf0);
        local_1140.title_._M_dataplus._M_p = (peVar16->title_)._M_dataplus._M_p;
        paVar13 = &(peVar16->title_).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1140.title_._M_dataplus._M_p == paVar13) {
          local_1140.title_.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_1140.title_.field_2._8_8_ = *(undefined8 *)((long)&(peVar16->title_).field_2 + 8);
          local_1140.title_._M_dataplus._M_p = (pointer)paVar34;
        }
        else {
          local_1140.title_.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        }
        paVar1 = &local_1140.suffix_.field_2;
        local_1140.title_._M_string_length = (peVar16->title_)._M_string_length;
        (peVar16->title_)._M_dataplus._M_p = (pointer)paVar13;
        (peVar16->title_)._M_string_length = 0;
        (peVar16->title_).field_2._M_local_buf[0] = '\0';
        local_1140.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (peVar16->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1140.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (peVar16->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1140.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (peVar16->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (peVar16->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (peVar16->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (peVar16->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1140.suffix_._M_dataplus._M_p = (peVar16->suffix_)._M_dataplus._M_p;
        paVar13 = &(peVar16->suffix_).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1140.suffix_._M_dataplus._M_p == paVar13) {
          local_1140.suffix_.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_1140.suffix_.field_2._8_8_ = *(undefined8 *)((long)&(peVar16->suffix_).field_2 + 8);
          local_1140.suffix_._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1140.suffix_.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        }
        local_1140.suffix_._M_string_length = (peVar16->suffix_)._M_string_length;
        (peVar16->suffix_)._M_dataplus._M_p = (pointer)paVar13;
        (peVar16->suffix_)._M_string_length = 0;
        (peVar16->suffix_).field_2._M_local_buf[0] = '\0';
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
        emplace_back<toml::error_info>
                  ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                   &local_1140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1140.suffix_._M_dataplus._M_p != paVar1) {
          operator_delete(local_1140.suffix_._M_dataplus._M_p,
                          local_1140.suffix_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_1140.locations_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1140.title_._M_dataplus._M_p != paVar34) {
          operator_delete(local_1140.title_._M_dataplus._M_p,
                          local_1140.title_.field_2._M_allocated_capacity + 1);
        }
        __str = ctx;
        skip_comment_block<toml::type_config>(loc,ctx);
LAB_0039f9c5:
        iVar26 = 0;
      }
      result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
      ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                 *)local_1380,(EVP_PKEY_CTX *)__str);
    } while (iVar26 == 0);
    parse_table<toml::type_config>
              ((result<toml::detail::none_t,_toml::error_info> *)local_10e8,loc,ctx,
               (basic_value<toml::type_config> *)local_850);
    pbVar21 = extraout_RDX;
    if (local_10e8[0] == false) {
      peVar14 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                          ((result<toml::detail::none_t,_toml::error_info> *)local_10e8,
                           (source_location)0x539c08);
      pcVar4 = (peVar14->title_)._M_dataplus._M_p;
      local_b20._0_8_ = local_b20 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b20,pcVar4,pcVar4 + (peVar14->title_)._M_string_length);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_b20 + 0x20),&peVar14->locations_);
      pcVar4 = (peVar14->suffix_)._M_dataplus._M_p;
      local_ae8._M_p = (pointer)&local_ad8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ae8,pcVar4,pcVar4 + (peVar14->suffix_)._M_string_length);
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
      emplace_back<toml::error_info>
                ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                 (error_info *)local_b20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ae8._M_p != &local_ad8) {
        operator_delete(local_ae8._M_p,local_ad8._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_b20 + 0x20));
      if ((undefined1 *)local_b20._0_8_ != local_b20 + 0x10) {
        operator_delete((void *)local_b20._0_8_,local_b20._16_8_ + 1);
      }
      skip_until_next_table<toml::type_config>(loc,ctx);
      pbVar21 = extraout_RDX_00;
    }
    if (local_10e8[0] == false) {
      failure<toml::error_info>::~failure((failure<toml::error_info> *)auStack_10e0);
      pbVar21 = extraout_RDX_01;
    }
    peVar2 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (loc->location_ <
        (ulong)((long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
      local_1158 = &local_358.comments_;
      local_13b8 = &local_12d0;
      local_13b0 = &vStack_1038;
      local_1148 = &local_290.comments_;
      do {
        skip_multiline_spacer<toml::type_config>
                  ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_14e0,loc,
                   ctx,true);
        plVar28 = loc;
        parse_array_table_key<toml::type_config>
                  ((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                    *)local_1020,loc,ctx);
        plVar31 = loc;
        if (local_1020[0] == (string)0x1) {
          pvVar15 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                    ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                              *)local_1020,(source_location)0x539c20);
          local_1438.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pvVar15->first).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1438.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pvVar15->first).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1438.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pvVar15->first).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pvVar15->first).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar15->first).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar15->first).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar15 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                    ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                              *)local_1020,(source_location)0x539c38);
          local_1498._M_p = (pointer)&local_1488;
          local_14a8._0_8_ =
               (pvVar15->second).source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_14a8._8_8_ =
               (pvVar15->second).source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          (pvVar15->second).source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (pvVar15->second).source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pvVar15->second).source_name_._M_dataplus._M_p;
          paVar20 = &(pvVar15->second).source_name_.field_2;
          if (paVar23 == paVar20) {
            local_1488._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_1488._8_8_ = *(undefined8 *)((long)&(pvVar15->second).source_name_.field_2 + 8);
          }
          else {
            local_1488._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_1498._M_p = (pointer)paVar23;
          }
          local_1490 = (pointer)(pvVar15->second).source_name_._M_string_length;
          (pvVar15->second).source_name_._M_dataplus._M_p = (pointer)paVar20;
          (pvVar15->second).source_name_._M_string_length = 0;
          (pvVar15->second).source_name_.field_2._M_local_buf[0] = '\0';
          local_1448 = (pvVar15->second).last_column_;
          local_1478 = (pvVar15->second).length_;
          sStack_1470 = (pvVar15->second).first_;
          local_1468 = (undefined4)(pvVar15->second).first_line_;
          uStack_1464 = *(undefined4 *)((long)&(pvVar15->second).first_line_ + 4);
          uStack_1460 = (undefined4)(pvVar15->second).first_column_;
          uStack_145c = *(undefined4 *)((long)&(pvVar15->second).first_column_ + 4);
          local_1458 = (pvVar15->second).last_;
          sStack_1450 = (pvVar15->second).last_line_;
          local_1508.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1508.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1508.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          if (local_14c0 == true) {
            uVar25 = 0xffffffffffffffff;
            lVar36 = 0;
            while (uVar25 = uVar25 + 1,
                  uVar25 < (ulong)((long)(local_14e0._16_8_ - local_14e0._8_8_) >> 5)) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_1508,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)local_14e0._8_8_)->_M_p + lVar36));
              lVar36 = lVar36 + 0x20;
              if (local_14c0 == false) {
                std::__throw_bad_optional_access();
              }
            }
          }
          parse_comment_line<toml::type_config>
                    ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      *)local_10e8,loc,ctx);
          _Var29._M_head_impl = (scanner_base *)local_1380;
          if (local_10e8[0] == true) {
            pvVar12 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                *)local_10e8,(source_location)0x539c50);
            local_1370.field_2._M_local_buf[0] = '\0';
            bVar37 = (pvVar12->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged == true;
            if (bVar37) {
              local_1380 = (undefined1  [8])(local_1378 + 8);
              _Var33._M_p = (pvVar12->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)_Var29._M_head_impl,_Var33._M_p,
                         _Var33._M_p +
                         (pvVar12->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_string_length);
              local_1370.field_2._M_local_buf[0] = bVar37;
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_1508,(value_type *)_Var29._M_head_impl);
            }
            else {
              _Var29._M_head_impl = (scanner_base *)ctx;
              local_1370.field_2._M_local_buf[0] = bVar37;
              skip_whitespace<toml::type_config>(loc,ctx);
              peVar2 = (loc->source_).
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              uVar25 = loc->location_;
              uVar27 = (long)(peVar2->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar2->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start;
              if (uVar25 < uVar27) {
                local_12b8 = (undefined1  [8])local_14f0;
                local_12b0._0_1_ = 10;
                local_1418 = (undefined1  [8])&PTR__scanner_base_00539938;
                local_1410._0_8_ = "\r\n";
                local_1410._8_8_ =
                     (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                      )0x2;
                _Var29._M_head_impl = (scanner_base *)local_12b8;
                local_14b8 = uVar25;
                either::either<toml::detail::character,toml::detail::literal>
                          (&local_b40,(character *)_Var29._M_head_impl,(literal *)local_1418);
                psVar8 = local_b40.others_.
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (psVar35 = local_b40.others_.
                               super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                               ._M_impl.super__Vector_impl_data._M_start; psVar35 != psVar8;
                    psVar35 = psVar35 + 1) {
                  _Var29._M_head_impl =
                       (psVar35->scanner_)._M_t.
                       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
                  (*(_Var29._M_head_impl)->_vptr_scanner_base[2])(local_8b8,_Var29._M_head_impl,loc)
                  ;
                  if ((element_type *)local_8b8._0_8_ != (element_type *)0x0) {
                    if (psVar35 != psVar8) goto LAB_003a06e3;
                    break;
                  }
                  region::~region((region *)local_8b8);
                }
                region::region((region *)local_8b8);
LAB_003a06e3:
                bVar37 = (element_type *)local_8b8._0_8_ == (element_type *)0x0;
                uVar25 = local_14b8;
              }
              else {
                bVar37 = false;
              }
              if (uVar25 < uVar27) {
                region::~region((region *)local_8b8);
                std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::~vector(&local_b40.others_);
              }
              if (bVar37) {
                local_1238._M_dataplus._M_p = (pointer)&local_1238.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1238,"toml::parse_file: newline (or EOF) expected","");
                local_1390.super_scanner_base._vptr_scanner_base = local_14f0;
                local_1390.value_ = '\n';
                local_12b8 = (undefined1  [8])&PTR__scanner_base_00539938;
                local_12b0.fail_.value.title_._M_dataplus._M_p = (_Alloc_hider)"\r\n";
                local_12b0.fail_.value.title_._M_string_length = 2;
                either::either<toml::detail::character,toml::detail::literal>
                          ((either *)local_1418,&local_1390,(literal *)local_12b8);
                location::location(&local_550,loc);
                local_1178._M_dataplus._M_p = (pointer)&local_1178.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1178,"");
                make_syntax_error<toml::detail::either>
                          (&local_958,&local_1238,(either *)local_1418,&local_550,&local_1178);
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>
                          ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                           &local_958);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_958.suffix_._M_dataplus._M_p != &local_958.suffix_.field_2) {
                  operator_delete(local_958.suffix_._M_dataplus._M_p,
                                  local_958.suffix_.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector(&local_958.locations_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_958.title_._M_dataplus._M_p != &local_958.title_.field_2) {
                  operator_delete(local_958.title_._M_dataplus._M_p,
                                  local_958.title_.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1178._M_dataplus._M_p != &local_1178.field_2) {
                  operator_delete(local_1178._M_dataplus._M_p,
                                  local_1178.field_2._M_allocated_capacity + 1);
                }
                location::~location(&local_550);
                std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           *)local_1410);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1238._M_dataplus._M_p != &local_1238.field_2) {
                  operator_delete(local_1238._M_dataplus._M_p,
                                  local_1238.field_2._M_allocated_capacity + 1);
                }
                plVar31 = (location *)ctx;
                skip_until_next_table<toml::type_config>(loc,ctx);
LAB_003a1131:
                if ((local_1370.field_2._M_local_buf[0] == '\x01') &&
                   (local_1370.field_2._M_local_buf[0] = '\0',
                   local_1380 != (undefined1  [8])(local_1378 + 8))) {
                  plVar31 = (location *)((long)local_1370._M_dataplus._M_p + 1);
                  operator_delete((void *)local_1380,(ulong)plVar31);
                }
                goto LAB_003a1168;
              }
            }
            if ((local_1370.field_2._M_local_buf[0] == '\x01') &&
               (local_1370.field_2._M_local_buf[0] = '\0',
               local_1380 != (undefined1  [8])(local_1378 + 8))) {
              _Var29._M_head_impl = (scanner_base *)((long)local_1370._M_dataplus._M_p + 1);
              operator_delete((void *)local_1380,(ulong)_Var29._M_head_impl);
            }
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)local_10e8,(EVP_PKEY_CTX *)_Var29._M_head_impl);
            local_bd8._M_buckets = &local_bd8._M_single_bucket;
            local_bd8._M_bucket_count = 1;
            local_bd8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_bd8._M_element_count = 0;
            local_bd8._M_rehash_policy._M_max_load_factor = 1.0;
            local_bd8._M_rehash_policy._4_4_ = 0;
            local_bd8._M_rehash_policy._M_next_resize = 0;
            local_bd8._M_single_bucket = (__node_base_ptr)0x0;
            local_b78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_1508.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_b78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1508.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_b78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_1508.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1508.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1508.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1508.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            region::region(&local_98,(region *)local_14a8);
            fmt._0_8_ = (_func_int **)((ulong)((uint)local_14b0 & 0xffff0000) | 0x200);
            fmt.name_indent = 0;
            fmt.closing_indent = 0;
            local_14b0 = fmt._0_8_;
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)local_10e8,(table_type *)&local_bd8,fmt,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_b78,&local_98);
            region::~region(&local_98);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_b78);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_bd8);
            ptVar17 = basic_value<toml::type_config>::as_table_abi_cxx11_
                                ((basic_value<toml::type_config> *)local_850);
            local_718.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_14a8._0_8_;
            local_718.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_14a8._8_8_;
            local_14a8._0_8_ = (element_type *)0x0;
            local_14a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_718.source_name_._M_dataplus._M_p = (pointer)&local_718.source_name_.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1498._M_p == &local_1488) {
              local_718.source_name_.field_2._8_8_ = local_1488._8_8_;
            }
            else {
              local_718.source_name_._M_dataplus._M_p = local_1498._M_p;
            }
            local_718.source_name_.field_2._M_allocated_capacity = local_1488._M_allocated_capacity;
            local_718.source_name_._M_string_length = (size_type)local_1490;
            local_1490 = (pointer)0x0;
            local_1488._M_allocated_capacity = local_1488._M_allocated_capacity & 0xffffffffffffff00
            ;
            local_718.last_column_ = local_1448;
            local_718.first_line_ = CONCAT44(uStack_1464,local_1468);
            local_718.first_column_ = CONCAT44(uStack_145c,uStack_1460);
            local_718.last_ = local_1458;
            local_718.last_line_ = sStack_1450;
            local_718.length_ = local_1478;
            local_718.first_ = sStack_1470;
            local_1498._M_p = (pointer)&local_1488;
            basic_value<toml::type_config>::basic_value
                      (&local_290,(basic_value<toml::type_config> *)local_10e8);
            pEVar30 = (EVP_PKEY_CTX *)0x1;
            insert_value<toml::type_config>
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       local_1418,array_table,ptVar17,&local_1438,&local_718,&local_290);
            basic_value<toml::type_config>::cleanup(&local_290,pEVar30);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1148);
            region::~region(&local_290.region_);
            region::~region(&local_718);
            if (local_1418[0] != false) {
              ppbVar18 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                   ((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                     *)local_1418,(source_location)0x539cb0);
              pbVar21 = *ppbVar18;
              parse_table<toml::type_config>
                        ((result<toml::detail::none_t,_toml::error_info> *)local_1380,loc,ctx,
                         pbVar21);
              if (local_1380[0] == false) {
                peVar14 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                    ((result<toml::detail::none_t,_toml::error_info> *)local_1380,
                                     (source_location)0x539cc8);
                local_e38._0_8_ = local_e38 + 0x10;
                pcVar4 = (peVar14->title_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_e38,pcVar4,pcVar4 + (peVar14->title_)._M_string_length);
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_e38 + 0x20),&peVar14->locations_);
                local_e00._M_p = (pointer)&local_df0;
                pcVar4 = (peVar14->suffix_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_e00,pcVar4,pcVar4 + (peVar14->suffix_)._M_string_length)
                ;
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>
                          ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                           (error_info *)local_e38);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e00._M_p != &local_df0) {
                  operator_delete(local_e00._M_p,local_df0._M_allocated_capacity + 1);
                }
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_e38 + 0x20));
                if ((undefined1 *)local_e38._0_8_ != local_e38 + 0x10) {
                  operator_delete((void *)local_e38._0_8_,local_e38._16_8_ + 1);
                }
                plVar31 = (location *)ctx;
                skip_until_next_table<toml::type_config>(loc,ctx);
              }
              uVar6 = local_14e0[1];
              if ((local_14c0 == true) && (local_14e0[1] != none)) {
                ptVar11 = basic_value<toml::type_config>::as_table_fmt(pbVar21);
                iVar22 = local_14e0._4_4_;
                ptVar11->indent_type = uVar6;
                if (local_14c0 == false) {
                  std::__throw_bad_optional_access();
                }
                ptVar11 = basic_value<toml::type_config>::as_table_fmt(pbVar21);
LAB_003a152e:
                ptVar11->name_indent = iVar22;
              }
              goto LAB_003a1531;
            }
            peVar19 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                                ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *
                                 )local_1418,(source_location)0x539c80);
            local_d88._0_8_ = local_d88 + 0x10;
            pcVar4 = (peVar19->title_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_d88,pcVar4,pcVar4 + (peVar19->title_)._M_string_length);
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_d88 + 0x20),&peVar19->locations_);
            local_d50._M_p = (pointer)&local_d40;
            pcVar4 = (peVar19->suffix_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d50,pcVar4,pcVar4 + (peVar19->suffix_)._M_string_length);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>
                      ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                       (error_info *)local_d88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d50._M_p != &local_d40) {
              operator_delete(local_d50._M_p,local_d40._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(local_d88 + 0x20));
            if ((undefined1 *)local_d88._0_8_ != local_d88 + 0x10) {
              operator_delete((void *)local_d88._0_8_,local_d88._16_8_ + 1);
            }
            local_c18._M_buckets = &local_c18._M_single_bucket;
            local_c18._M_bucket_count = 1;
            local_c18._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_c18._M_element_count = 0;
            local_c18._M_rehash_policy._M_max_load_factor = 1.0;
            local_c18._M_rehash_policy._4_4_ = 0;
            local_c18._M_rehash_policy._M_next_resize = 0;
            local_c18._M_single_bucket = (__node_base_ptr)0x0;
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)local_1380,(table_type *)&local_c18);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_c18);
            parse_table<toml::type_config>
                      ((result<toml::detail::none_t,_toml::error_info> *)local_12b8,loc,ctx,
                       (basic_value<toml::type_config> *)local_1380);
            if (local_12b8[0] == false) {
              peVar14 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                  ((result<toml::detail::none_t,_toml::error_info> *)local_12b8,
                                   (source_location)0x539c98);
              local_de0._0_8_ = local_de0 + 0x10;
              pcVar4 = (peVar14->title_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_de0,pcVar4,pcVar4 + (peVar14->title_)._M_string_length);
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_de0 + 0x20),&peVar14->locations_);
              local_da8._M_p = (pointer)&local_d98;
              pcVar4 = (peVar14->suffix_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_da8,pcVar4,pcVar4 + (peVar14->suffix_)._M_string_length);
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>
                        ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                         (error_info *)local_de0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_da8._M_p != &local_d98) {
                operator_delete(local_da8._M_p,local_d98._M_allocated_capacity + 1);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_de0 + 0x20));
              if ((undefined1 *)local_de0._0_8_ != local_de0 + 0x10) {
                operator_delete((void *)local_de0._0_8_,local_de0._16_8_ + 1);
              }
              plVar31 = (location *)ctx;
              skip_until_next_table<toml::type_config>(loc,ctx);
            }
LAB_003a17b7:
            if (local_12b8[0] == false) {
              failure<toml::error_info>::~failure(&local_12b0.fail_);
            }
            basic_value<toml::type_config>::cleanup
                      ((basic_value<toml::type_config> *)local_1380,(EVP_PKEY_CTX *)plVar31);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_13b8);
            region::~region((region *)(local_1378 + 0x40));
LAB_003a17f0:
            if (local_1418[0] == false) {
              failure<toml::error_info>::~failure((failure<toml::error_info> *)local_1410);
            }
            basic_value<toml::type_config>::cleanup
                      ((basic_value<toml::type_config> *)local_10e8,(EVP_PKEY_CTX *)plVar31);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_13b0);
            region::~region((region *)(auStack_10e0 + 0x40));
          }
          else {
            peVar16 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                    *)local_10e8,(source_location)0x539c68);
            local_d30._0_8_ = local_d30 + 0x10;
            pcVar4 = (peVar16->title_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_d30,pcVar4,pcVar4 + (peVar16->title_)._M_string_length);
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_d30 + 0x20),&peVar16->locations_);
            local_cf8._M_p = (pointer)&local_ce8;
            pcVar4 = (peVar16->suffix_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_cf8,pcVar4,pcVar4 + (peVar16->suffix_)._M_string_length);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>
                      ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                       (error_info *)local_d30);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cf8._M_p != &local_ce8) {
              operator_delete(local_cf8._M_p,local_ce8._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(local_d30 + 0x20));
            if ((undefined1 *)local_d30._0_8_ != local_d30 + 0x10) {
              operator_delete((void *)local_d30._0_8_,local_d30._16_8_ + 1);
            }
            plVar31 = (location *)ctx;
            skip_until_next_table<toml::type_config>(loc,ctx);
LAB_003a1168:
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)local_10e8,(EVP_PKEY_CTX *)plVar31);
          }
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1508);
          region::~region((region *)local_14a8);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1438);
          result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
          ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                     *)local_1020,(EVP_PKEY_CTX *)plVar31);
          pbVar21 = extraout_RDX_03;
        }
        else {
          result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
          ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                     *)local_1020,(EVP_PKEY_CTX *)plVar28);
          plVar28 = loc;
          parse_table_key<toml::type_config>
                    ((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                      *)local_1020,loc,ctx);
          if (local_1020[0] == (string)0x1) {
            pvVar15 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                      ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                                *)local_1020,(source_location)0x539ce0);
            local_1438.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pvVar15->first).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1438.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pvVar15->first).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_1438.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pvVar15->first).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pvVar15->first).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pvVar15->first).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pvVar15->first).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar15 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                      ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                                *)local_1020,(source_location)0x539cf8);
            local_1498._M_p = (pointer)&local_1488;
            local_14a8._0_8_ =
                 (pvVar15->second).source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
            local_14a8._8_8_ =
                 (pvVar15->second).source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            (pvVar15->second).source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (pvVar15->second).source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pvVar15->second).source_name_._M_dataplus._M_p;
            paVar20 = &(pvVar15->second).source_name_.field_2;
            if (paVar23 == paVar20) {
              local_1488._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_1488._8_8_ = *(undefined8 *)((long)&(pvVar15->second).source_name_.field_2 + 8);
            }
            else {
              local_1488._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_1498._M_p = (pointer)paVar23;
            }
            local_1490 = (pointer)(pvVar15->second).source_name_._M_string_length;
            (pvVar15->second).source_name_._M_dataplus._M_p = (pointer)paVar20;
            (pvVar15->second).source_name_._M_string_length = 0;
            (pvVar15->second).source_name_.field_2._M_local_buf[0] = '\0';
            local_1448 = (pvVar15->second).last_column_;
            local_1478 = (pvVar15->second).length_;
            sStack_1470 = (pvVar15->second).first_;
            local_1468 = (undefined4)(pvVar15->second).first_line_;
            uStack_1464 = *(undefined4 *)((long)&(pvVar15->second).first_line_ + 4);
            uStack_1460 = (undefined4)(pvVar15->second).first_column_;
            uStack_145c = *(undefined4 *)((long)&(pvVar15->second).first_column_ + 4);
            local_1458 = (pvVar15->second).last_;
            sStack_1450 = (pvVar15->second).last_line_;
            local_1508.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1508.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1508.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            if (local_14c0 == true) {
              uVar25 = 0xffffffffffffffff;
              lVar36 = 0;
              while (uVar25 = uVar25 + 1,
                    uVar25 < (ulong)((long)(local_14e0._16_8_ - local_14e0._8_8_) >> 5)) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_1508,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((_Alloc_hider *)local_14e0._8_8_)->_M_p + lVar36));
                lVar36 = lVar36 + 0x20;
                if (local_14c0 == false) {
                  std::__throw_bad_optional_access();
                }
              }
            }
            parse_comment_line<toml::type_config>
                      ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        *)local_10e8,loc,ctx);
            _Var29._M_head_impl = (scanner_base *)local_1380;
            if (local_10e8[0] != true) {
              peVar16 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                      *)local_10e8,(source_location)0x539d28);
              local_e90._0_8_ = local_e90 + 0x10;
              pcVar4 = (peVar16->title_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_e90,pcVar4,pcVar4 + (peVar16->title_)._M_string_length);
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_e90 + 0x20),&peVar16->locations_);
              local_e58._M_p = (pointer)&local_e48;
              pcVar4 = (peVar16->suffix_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e58,pcVar4,pcVar4 + (peVar16->suffix_)._M_string_length);
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>
                        ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                         (error_info *)local_e90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e58._M_p != &local_e48) {
                operator_delete(local_e58._M_p,local_e48._M_allocated_capacity + 1);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_e90 + 0x20));
              if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
                operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
              }
              plVar31 = (location *)ctx;
              skip_until_next_table<toml::type_config>(loc,ctx);
              goto LAB_003a1168;
            }
            pvVar12 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                *)local_10e8,(source_location)0x539d10);
            local_1370.field_2._M_local_buf[0] = '\0';
            bVar37 = (pvVar12->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged == true;
            if (bVar37) {
              local_1380 = (undefined1  [8])(local_1378 + 8);
              _Var33._M_p = (pvVar12->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)_Var29._M_head_impl,_Var33._M_p,
                         _Var33._M_p +
                         (pvVar12->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_string_length);
              local_1370.field_2._M_local_buf[0] = bVar37;
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_1508,(value_type *)_Var29._M_head_impl);
            }
            else {
              _Var29._M_head_impl = (scanner_base *)ctx;
              local_1370.field_2._M_local_buf[0] = bVar37;
              skip_whitespace<toml::type_config>(loc,ctx);
              peVar2 = (loc->source_).
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              uVar25 = loc->location_;
              uVar27 = (long)(peVar2->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar2->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start;
              if (uVar25 < uVar27) {
                local_12b8 = (undefined1  [8])local_14f0;
                local_12b0._0_1_ = 10;
                local_1418 = (undefined1  [8])&PTR__scanner_base_00539938;
                local_1410._0_8_ = "\r\n";
                local_1410._8_8_ =
                     (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                      )0x2;
                _Var29._M_head_impl = (scanner_base *)local_12b8;
                local_14b8 = uVar25;
                either::either<toml::detail::character,toml::detail::literal>
                          (&local_b60,(character *)_Var29._M_head_impl,(literal *)local_1418);
                psVar8 = local_b60.others_.
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (psVar35 = local_b60.others_.
                               super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                               ._M_impl.super__Vector_impl_data._M_start; psVar35 != psVar8;
                    psVar35 = psVar35 + 1) {
                  _Var29._M_head_impl =
                       (psVar35->scanner_)._M_t.
                       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
                  (*(_Var29._M_head_impl)->_vptr_scanner_base[2])
                            (&local_ac8,_Var29._M_head_impl,loc);
                  if (local_ac8.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr != (element_type *)0x0) {
                    if (psVar35 != psVar8) goto LAB_003a0f2d;
                    break;
                  }
                  region::~region(&local_ac8);
                }
                region::region(&local_ac8);
LAB_003a0f2d:
                bVar37 = local_ac8.source_.
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr == (element_type *)0x0;
                uVar25 = local_14b8;
              }
              else {
                bVar37 = false;
              }
              if (uVar25 < uVar27) {
                region::~region(&local_ac8);
                std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::~vector(&local_b60.others_);
              }
              if (bVar37) {
                local_1258._M_dataplus._M_p = (pointer)&local_1258.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1258,"toml::parse_file: newline (or EOF) expected","");
                local_1390.super_scanner_base._vptr_scanner_base = local_14f0;
                local_1390.value_ = '\n';
                local_12b8 = (undefined1  [8])&PTR__scanner_base_00539938;
                local_12b0.fail_.value.title_._M_dataplus._M_p = (_Alloc_hider)"\r\n";
                local_12b0.fail_.value.title_._M_string_length = 2;
                either::either<toml::detail::character,toml::detail::literal>
                          ((either *)local_1418,&local_1390,(literal *)local_12b8);
                location::location(&local_598,loc);
                local_1198._M_dataplus._M_p = (pointer)&local_1198.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1198,"");
                make_syntax_error<toml::detail::either>
                          (&local_9b0,&local_1258,(either *)local_1418,&local_598,&local_1198);
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>
                          ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                           &local_9b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_9b0.suffix_._M_dataplus._M_p != &local_9b0.suffix_.field_2) {
                  operator_delete(local_9b0.suffix_._M_dataplus._M_p,
                                  local_9b0.suffix_.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector(&local_9b0.locations_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_9b0.title_._M_dataplus._M_p != &local_9b0.title_.field_2) {
                  operator_delete(local_9b0.title_._M_dataplus._M_p,
                                  local_9b0.title_.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1198._M_dataplus._M_p != &local_1198.field_2) {
                  operator_delete(local_1198._M_dataplus._M_p,
                                  local_1198.field_2._M_allocated_capacity + 1);
                }
                location::~location(&local_598);
                std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           *)local_1410);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1258._M_dataplus._M_p != &local_1258.field_2) {
                  operator_delete(local_1258._M_dataplus._M_p,
                                  local_1258.field_2._M_allocated_capacity + 1);
                }
                plVar31 = (location *)ctx;
                skip_until_next_table<toml::type_config>(loc,ctx);
                goto LAB_003a1131;
              }
            }
            if ((local_1370.field_2._M_local_buf[0] == '\x01') &&
               (local_1370.field_2._M_local_buf[0] = '\0',
               local_1380 != (undefined1  [8])(local_1378 + 8))) {
              _Var29._M_head_impl = (scanner_base *)((long)local_1370._M_dataplus._M_p + 1);
              operator_delete((void *)local_1380,(ulong)_Var29._M_head_impl);
            }
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)local_10e8,(EVP_PKEY_CTX *)_Var29._M_head_impl);
            local_c58._M_buckets = &local_c58._M_single_bucket;
            local_c58._M_bucket_count = 1;
            local_c58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_c58._M_element_count = 0;
            local_c58._M_rehash_policy._M_max_load_factor = 1.0;
            local_c58._M_rehash_policy._4_4_ = 0;
            local_c58._M_rehash_policy._M_next_resize = 0;
            local_c58._M_single_bucket = (__node_base_ptr)0x0;
            local_b98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_1508.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_b98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1508.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_b98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_1508.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1508.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1508.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1508.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            region::region(&local_100,(region *)local_14a8);
            fmt_00._0_8_ = (ulong)((uint)local_1150 & 0xffff0000) | 0x200;
            fmt_00.name_indent = 0;
            fmt_00.closing_indent = 0;
            local_1150 = fmt_00._0_8_;
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)local_10e8,(table_type *)&local_c58,fmt_00,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_b98,&local_100);
            region::~region(&local_100);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_b98);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_c58);
            ptVar17 = basic_value<toml::type_config>::as_table_abi_cxx11_
                                ((basic_value<toml::type_config> *)local_850);
            local_788.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_14a8._0_8_;
            local_788.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_14a8._8_8_;
            local_14a8._0_8_ = (element_type *)0x0;
            local_14a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_788.source_name_._M_dataplus._M_p = (pointer)&local_788.source_name_.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1498._M_p == &local_1488) {
              local_788.source_name_.field_2._8_8_ = local_1488._8_8_;
            }
            else {
              local_788.source_name_._M_dataplus._M_p = local_1498._M_p;
            }
            local_788.source_name_.field_2._M_allocated_capacity = local_1488._M_allocated_capacity;
            local_788.source_name_._M_string_length = (size_type)local_1490;
            local_1490 = (pointer)0x0;
            local_1488._M_allocated_capacity = local_1488._M_allocated_capacity & 0xffffffffffffff00
            ;
            local_788.last_column_ = local_1448;
            local_788.first_line_ = CONCAT44(uStack_1464,local_1468);
            local_788.first_column_ = CONCAT44(uStack_145c,uStack_1460);
            local_788.last_ = local_1458;
            local_788.last_line_ = sStack_1450;
            local_788.length_ = local_1478;
            local_788.first_ = sStack_1470;
            local_1498._M_p = (pointer)&local_1488;
            basic_value<toml::type_config>::basic_value
                      (&local_358,(basic_value<toml::type_config> *)local_10e8);
            pEVar30 = (EVP_PKEY_CTX *)0x0;
            insert_value<toml::type_config>
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       local_1418,std_table,ptVar17,&local_1438,&local_788,&local_358);
            basic_value<toml::type_config>::cleanup(&local_358,pEVar30);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1158);
            region::~region(&local_358.region_);
            region::~region(&local_788);
            if (local_1418[0] == false) {
              peVar19 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                                  ((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                    *)local_1418,(source_location)0x539d40);
              local_ee8._0_8_ = local_ee8 + 0x10;
              pcVar4 = (peVar19->title_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_ee8,pcVar4,pcVar4 + (peVar19->title_)._M_string_length);
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_ee8 + 0x20),&peVar19->locations_);
              local_eb0._M_p = (pointer)&local_ea0;
              pcVar4 = (peVar19->suffix_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_eb0,pcVar4,pcVar4 + (peVar19->suffix_)._M_string_length);
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>
                        ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                         (error_info *)local_ee8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_eb0._M_p != &local_ea0) {
                operator_delete(local_eb0._M_p,local_ea0._M_allocated_capacity + 1);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_ee8 + 0x20));
              if ((undefined1 *)local_ee8._0_8_ != local_ee8 + 0x10) {
                operator_delete((void *)local_ee8._0_8_,local_ee8._16_8_ + 1);
              }
              local_c98._M_buckets = &local_c98._M_single_bucket;
              local_c98._M_bucket_count = 1;
              local_c98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_c98._M_element_count = 0;
              local_c98._M_rehash_policy._M_max_load_factor = 1.0;
              local_c98._M_rehash_policy._4_4_ = 0;
              local_c98._M_rehash_policy._M_next_resize = 0;
              local_c98._M_single_bucket = (__node_base_ptr)0x0;
              basic_value<toml::type_config>::basic_value
                        ((basic_value<toml::type_config> *)local_1380,(table_type *)&local_c98);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&local_c98);
              parse_table<toml::type_config>
                        ((result<toml::detail::none_t,_toml::error_info> *)local_12b8,loc,ctx,
                         (basic_value<toml::type_config> *)local_1380);
              if (local_12b8[0] == false) {
                peVar14 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                    ((result<toml::detail::none_t,_toml::error_info> *)local_12b8,
                                     (source_location)0x539d58);
                local_f40._0_8_ = local_f40 + 0x10;
                pcVar4 = (peVar14->title_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_f40,pcVar4,pcVar4 + (peVar14->title_)._M_string_length);
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_f40 + 0x20),&peVar14->locations_);
                local_f08._M_p = (pointer)&local_ef8;
                pcVar4 = (peVar14->suffix_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f08,pcVar4,pcVar4 + (peVar14->suffix_)._M_string_length)
                ;
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>
                          ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                           (error_info *)local_f40);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f08._M_p != &local_ef8) {
                  operator_delete(local_f08._M_p,local_ef8._M_allocated_capacity + 1);
                }
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_f40 + 0x20));
                if ((undefined1 *)local_f40._0_8_ != local_f40 + 0x10) {
                  operator_delete((void *)local_f40._0_8_,local_f40._16_8_ + 1);
                }
                plVar31 = (location *)ctx;
                skip_until_next_table<toml::type_config>(loc,ctx);
              }
              goto LAB_003a17b7;
            }
            ppbVar18 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                 ((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                   *)local_1418,(source_location)0x539d70);
            pbVar21 = *ppbVar18;
            parse_table<toml::type_config>
                      ((result<toml::detail::none_t,_toml::error_info> *)local_1380,loc,ctx,pbVar21)
            ;
            if (local_1380[0] == false) {
              peVar14 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                  ((result<toml::detail::none_t,_toml::error_info> *)local_1380,
                                   (source_location)0x539d88);
              local_f98._0_8_ = local_f98 + 0x10;
              pcVar4 = (peVar14->title_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_f98,pcVar4,pcVar4 + (peVar14->title_)._M_string_length);
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_f98 + 0x20),&peVar14->locations_);
              local_f60._M_p = (pointer)&local_f50;
              pcVar4 = (peVar14->suffix_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f60,pcVar4,pcVar4 + (peVar14->suffix_)._M_string_length);
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>
                        ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                         (error_info *)local_f98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f60._M_p != &local_f50) {
                operator_delete(local_f60._M_p,local_f50._M_allocated_capacity + 1);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_f98 + 0x20));
              if ((undefined1 *)local_f98._0_8_ != local_f98 + 0x10) {
                operator_delete((void *)local_f98._0_8_,local_f98._16_8_ + 1);
              }
              plVar31 = (location *)ctx;
              skip_until_next_table<toml::type_config>(loc,ctx);
            }
            uVar6 = local_14e0[1];
            if ((local_14c0 == true) && (local_14e0[1] != none)) {
              ptVar11 = basic_value<toml::type_config>::as_table_fmt(pbVar21);
              iVar22 = local_14e0._4_4_;
              ptVar11->indent_type = uVar6;
              if (local_14c0 == false) {
                std::__throw_bad_optional_access();
              }
              ptVar11 = basic_value<toml::type_config>::as_table_fmt(pbVar21);
              goto LAB_003a152e;
            }
LAB_003a1531:
            if (local_1380[0] == false) {
              failure<toml::error_info>::~failure((failure<toml::error_info> *)local_1378);
            }
            goto LAB_003a17f0;
          }
          result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
          ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                     *)local_1020,(EVP_PKEY_CTX *)plVar28);
          location::location((location *)local_1380,loc);
          local_1020 = (undefined1  [8])&PTR__scanner_base_00539938;
          local_1018._0_8_ = "[[";
          local_1018._8_8_ = (pointer)0x2;
          literal::scan((region *)local_10e8,(literal *)local_1020,loc);
          auVar7 = local_10e8;
          region::~region((region *)local_10e8);
          (loc->source_).
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_1380;
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_1398,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1378);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign(local_13a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_1378 + 8));
          local_13a8[2] = local_1340;
          *(undefined4 *)local_13a8 = local_1350;
          *(undefined4 *)((long)local_13a8 + 4) = uStack_134c;
          *(undefined4 *)(local_13a8 + 1) = uStack_1348;
          *(undefined4 *)((long)local_13a8 + 0xc) = uStack_1344;
          if (auVar7 == (undefined1  [8])0x0) {
            local_11f8._M_dataplus._M_p = (pointer)&local_11f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_11f8,"toml::parse_file: invalid table key","");
            syntax::std_table((sequence *)local_10e8,&ctx->toml_spec_);
            location::location(&local_628,loc);
            local_1218._M_dataplus._M_p = (pointer)&local_1218.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1218,"");
            make_syntax_error<toml::detail::sequence>
                      (&local_a60,&local_11f8,(sequence *)local_10e8,&local_628,&local_1218);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>
                      ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                       &local_a60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a60.suffix_._M_dataplus._M_p != &local_a60.suffix_.field_2) {
              operator_delete(local_a60.suffix_._M_dataplus._M_p,
                              local_a60.suffix_.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_a60.locations_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a60.title_._M_dataplus._M_p != &local_a60.title_.field_2) {
              operator_delete(local_a60.title_._M_dataplus._M_p,
                              local_a60.title_.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1218._M_dataplus._M_p != &local_1218.field_2) {
              operator_delete(local_1218._M_dataplus._M_p,
                              local_1218.field_2._M_allocated_capacity + 1);
            }
            location::~location(&local_628);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)auStack_10e0);
            psVar5 = &local_11f8;
            _Var33._M_p = local_11f8._M_dataplus._M_p;
          }
          else {
            local_11b8._M_dataplus._M_p = (pointer)&local_11b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_11b8,"toml::parse_file: invalid array-table key","");
            syntax::array_table((sequence *)local_10e8,&ctx->toml_spec_);
            location::location(&local_5e0,loc);
            local_11d8._M_dataplus._M_p = (pointer)&local_11d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_11d8,"");
            make_syntax_error<toml::detail::sequence>
                      (&local_a08,&local_11b8,(sequence *)local_10e8,&local_5e0,&local_11d8);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>
                      ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32,
                       &local_a08);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a08.suffix_._M_dataplus._M_p != &local_a08.suffix_.field_2) {
              operator_delete(local_a08.suffix_._M_dataplus._M_p,
                              local_a08.suffix_.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_a08.locations_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a08.title_._M_dataplus._M_p != &local_a08.title_.field_2) {
              operator_delete(local_a08.title_._M_dataplus._M_p,
                              local_a08.title_.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_11d8._M_dataplus._M_p != &local_11d8.field_2) {
              operator_delete(local_11d8._M_dataplus._M_p,
                              local_11d8.field_2._M_allocated_capacity + 1);
            }
            location::~location(&local_5e0);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)auStack_10e0);
            psVar5 = &local_11b8;
            _Var33._M_p = local_11b8._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var33._M_p != &psVar5->field_2) {
            operator_delete(_Var33._M_p,(psVar5->field_2)._M_allocated_capacity + 1);
          }
          skip_until_next_table<toml::type_config>(loc,ctx);
          location::~location((location *)local_1380);
          pbVar21 = extraout_RDX_02;
        }
        if (local_14c0 == true) {
          local_14c0 = false;
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_14e0 + 8));
          pbVar21 = extraout_RDX_04;
        }
        peVar2 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      } while (loc->location_ <
               (ulong)((long)(peVar2->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(peVar2->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start));
    }
    if ((ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_420,(toml *)local_850,
                 pbVar21);
      local_14e8->is_ok_ = true;
      pbVar32 = &local_420;
      basic_value<toml::type_config>::basic_value(&(local_14e8->field_1).succ_.value,pbVar32);
      basic_value<toml::type_config>::cleanup(&local_420,(EVP_PKEY_CTX *)pbVar32);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_420.comments_);
      region::~region(&local_420.region_);
    }
    else {
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::vector
                ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)local_10e8,
                 (vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar32);
      local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_10e8;
      local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)auStack_10e0._0_8_;
      local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)auStack_10e0._8_8_;
      local_10e8 = (undefined1  [8])0x0;
      auStack_10e0._0_8_ = (pointer)0x0;
      auStack_10e0._8_8_ = (pointer)0x0;
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::~vector
                ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)local_10e8);
      local_14e8->is_ok_ = false;
      (local_14e8->field_1).fail_.value.
      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl
           .super__Vector_impl_data._M_start;
      (local_14e8->field_1).fail_.value.
      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl
           .super__Vector_impl_data._M_finish;
      (local_14e8->field_1).fail_.value.
      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::~vector(&local_508);
    }
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_850,(EVP_PKEY_CTX *)pbVar32);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7a0);
    region::~region((region *)(local_850 + 0x48));
  }
  else {
    local_668._M_buckets = &local_668._M_single_bucket;
    local_668._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_668._M_element_count = 0;
    local_668._M_bucket_count = 1;
    local_668._M_rehash_policy._M_max_load_factor = 1.0;
    local_668._M_rehash_policy._4_4_ = 0;
    local_668._M_rehash_policy._M_next_resize = 0;
    local_668._M_single_bucket = (__node_base_ptr)0x0;
    local_cb8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_cb8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_cb8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_488,loc);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_850,(table_type *)&local_668,
               (table_format_info)ZEXT816(0),&local_cb8,&local_488);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_1c8,(toml *)local_850,v);
    local_14e8->is_ok_ = true;
    pbVar32 = &local_1c8;
    basic_value<toml::type_config>::basic_value(&(local_14e8->field_1).succ_.value,&local_1c8);
    basic_value<toml::type_config>::cleanup(&local_1c8,(EVP_PKEY_CTX *)pbVar32);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c8.comments_);
    region::~region(&local_1c8.region_);
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_850,(EVP_PKEY_CTX *)pbVar32);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7a0);
    region::~region((region *)(local_850 + 0x48));
    region::~region(&local_488);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_cb8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_668);
  }
  location::~location((location *)local_900);
  return local_14e8;
}

Assistant:

result<basic_value<TC>, std::vector<error_info>>
parse_file(location& loc, context<TC>& ctx)
{
    using value_type = basic_value<TC>;
    using table_type = typename value_type::table_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    if(loc.eof())
    {
        return ok(value_type(table_type(), table_format_info{}, {}, region(loc)));
    }

    value_type root(table_type(), table_format_info{}, {}, region(loc));
    root.as_table_fmt().fmt = table_format::multiline;
    root.as_table_fmt().indent_type = indent_char::none;

    // parse top comment.
    //
    // ```toml
    // # this is a comment for the top-level table.
    //
    // key = "the first value"
    // ```
    //
    // ```toml
    // # this is a comment for "the first value".
    // key = "the first value"
    // ```
    while( ! loc.eof())
    {
        if(auto com_res = parse_comment_line(loc, ctx))
        {
            if(auto com_opt = com_res.unwrap())
            {
                root.comments().push_back(std::move(com_opt.value()));
            }
            else // no comment found.
            {
                // if it is not an empty line, clear the root comment.
                if( ! sequence(syntax::ws(spec), syntax::newline(spec)).scan(loc).is_ok())
                {
                    loc = first;
                    root.comments().clear();
                }
                break;
            }
        }
        else
        {
            ctx.report_error(std::move(com_res.unwrap_err()));
            skip_comment_block(loc, ctx);
        }
    }

    // parse root table
    {
        const auto res = parse_table(loc, ctx, root);
        if(res.is_err())
        {
            ctx.report_error(std::move(res.unwrap_err()));
            skip_until_next_table(loc, ctx);
        }
    }

    // parse tables

    while( ! loc.eof())
    {
        auto sp = skip_multiline_spacer(loc, ctx, /*newline_found=*/true);

        if(auto key_res = parse_array_table_key(loc, ctx))
        {
            auto key = std::move(std::get<0>(key_res.unwrap()));
            auto reg = std::move(std::get<1>(key_res.unwrap()));

            std::vector<std::string> com;
            if(sp.has_value())
            {
                for(std::size_t i=0; i<sp.value().comments.size(); ++i)
                {
                    com.push_back(std::move(sp.value().comments.at(i)));
                }
            }

            // [table.def] must be followed by one of
            // - a comment line
            // - whitespace + newline
            // - EOF
            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    com.push_back(com_opt.value());
                }
                else // if there is no comment, ws+newline must exist (or EOF)
                {
                    skip_whitespace(loc, ctx);
                    if( ! loc.eof() && ! syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
                    {
                        ctx.report_error(make_syntax_error("toml::parse_file: "
                            "newline (or EOF) expected",
                            syntax::newline(ctx.toml_spec()), loc));
                        skip_until_next_table(loc, ctx);
                        continue;
                    }
                }
            }
            else // comment syntax error (rare)
            {
                ctx.report_error(com_res.unwrap_err());
                skip_until_next_table(loc, ctx);
                continue;
            }

            table_format_info fmt;
            fmt.fmt = table_format::multiline;
            fmt.indent_type = indent_char::none;
            auto tab = value_type(table_type{}, std::move(fmt), std::move(com), reg);

            auto inserted = insert_value(inserting_value_kind::array_table,
                std::addressof(root.as_table()),
                key, std::move(reg), std::move(tab));

            if(inserted.is_err())
            {
                ctx.report_error(inserted.unwrap_err());

                // check errors in the table
                auto tmp = basic_value<TC>(table_type());
                auto res = parse_table(loc, ctx, tmp);
                if(res.is_err())
                {
                    ctx.report_error(res.unwrap_err());
                    skip_until_next_table(loc, ctx);
                }
                continue;
            }

            auto tab_ptr = inserted.unwrap();
            assert(tab_ptr);

            const auto tab_res = parse_table(loc, ctx, *tab_ptr);
            if(tab_res.is_err())
            {
                ctx.report_error(tab_res.unwrap_err());
                skip_until_next_table(loc, ctx);
            }

            // parse_table first clears `indent_type`.
            // to keep header indent info, we must store it later.
            if(sp.has_value() && sp.value().indent_type != indent_char::none)
            {
                tab_ptr->as_table_fmt().indent_type = sp.value().indent_type;
                tab_ptr->as_table_fmt().name_indent = sp.value().indent;
            }
            continue;
        }
        if(auto key_res = parse_table_key(loc, ctx))
        {
            auto key = std::move(std::get<0>(key_res.unwrap()));
            auto reg = std::move(std::get<1>(key_res.unwrap()));

            std::vector<std::string> com;
            if(sp.has_value())
            {
                for(std::size_t i=0; i<sp.value().comments.size(); ++i)
                {
                    com.push_back(std::move(sp.value().comments.at(i)));
                }
            }

            // [table.def] must be followed by one of
            // - a comment line
            // - whitespace + newline
            // - EOF
            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    com.push_back(com_opt.value());
                }
                else // if there is no comment, ws+newline must exist (or EOF)
                {
                    skip_whitespace(loc, ctx);
                    if( ! loc.eof() && ! syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
                    {
                        ctx.report_error(make_syntax_error("toml::parse_file: "
                            "newline (or EOF) expected",
                            syntax::newline(ctx.toml_spec()), loc));
                        skip_until_next_table(loc, ctx);
                        continue;
                    }
                }
            }
            else // comment syntax error (rare)
            {
                ctx.report_error(com_res.unwrap_err());
                skip_until_next_table(loc, ctx);
                continue;
            }

            table_format_info fmt;
            fmt.fmt = table_format::multiline;
            fmt.indent_type = indent_char::none;
            auto tab = value_type(table_type{}, std::move(fmt), std::move(com), reg);

            auto inserted = insert_value(inserting_value_kind::std_table,
                std::addressof(root.as_table()),
                key, std::move(reg), std::move(tab));

            if(inserted.is_err())
            {
                ctx.report_error(inserted.unwrap_err());

                // check errors in the table
                auto tmp = basic_value<TC>(table_type());
                auto res = parse_table(loc, ctx, tmp);
                if(res.is_err())
                {
                    ctx.report_error(res.unwrap_err());
                    skip_until_next_table(loc, ctx);
                }
                continue;
            }

            auto tab_ptr = inserted.unwrap();
            assert(tab_ptr);

            const auto tab_res = parse_table(loc, ctx, *tab_ptr);
            if(tab_res.is_err())
            {
                ctx.report_error(tab_res.unwrap_err());
                skip_until_next_table(loc, ctx);
            }
            if(sp.has_value() && sp.value().indent_type != indent_char::none)
            {
                tab_ptr->as_table_fmt().indent_type = sp.value().indent_type;
                tab_ptr->as_table_fmt().name_indent = sp.value().indent;
            }
            continue;
        }

        // does not match array_table nor std_table. report an error.
        const auto keytop = loc;
        const auto maybe_array_of_tables = literal("[[").scan(loc).is_ok();
        loc = keytop;

        if(maybe_array_of_tables)
        {
            ctx.report_error(make_syntax_error("toml::parse_file: invalid array-table key",
                syntax::array_table(spec), loc));
        }
        else
        {
            ctx.report_error(make_syntax_error("toml::parse_file: invalid table key",
                syntax::std_table(spec), loc));
        }
        skip_until_next_table(loc, ctx);
    }

    if( ! ctx.errors().empty())
    {
        return err(std::move(ctx.errors()));
    }
    return ok(std::move(root));
}